

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Status.hpp
# Opt level: O2

bool __thiscall InstructionSet::M68k::Status::set_status(Status *this,uint16_t status)

{
  bool bVar1;
  
  set_ccr(this,status);
  this->interrupt_level = (status & 0x700) >> 8;
  this->trace_flag = (ulong)(status & 0x8000);
  bVar1 = SUB41((status & 0x2000) >> 0xd,0);
  this->is_supervisor = bVar1;
  return bVar1;
}

Assistant:

constexpr bool set_status(uint16_t status) {
		set_ccr(status);

		interrupt_level	= (status >> 8) & 7;
		trace_flag		= status & ConditionCode::Trace;
		is_supervisor	= status & ConditionCode::Supervisor;

		return is_supervisor;
	}